

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O2

U32 ZSTD_window_update(ZSTD_window_t *window,void *src,size_t srcSize,int forceNonContiguous)

{
  U32 UVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  U32 UVar4;
  ulong uVar5;
  U32 UVar6;
  
  if (srcSize != 0) {
    if (forceNonContiguous == 0 && window->nextSrc == (BYTE *)src) {
      pBVar2 = window->dictBase;
      UVar6 = window->lowLimit;
      uVar5 = (ulong)window->dictLimit;
      UVar1 = 1;
    }
    else {
      pBVar2 = window->base;
      uVar5 = (long)window->nextSrc - (long)pBVar2;
      UVar6 = window->dictLimit;
      window->lowLimit = UVar6;
      UVar4 = (U32)uVar5;
      window->dictLimit = UVar4;
      window->dictBase = pBVar2;
      window->base = (BYTE *)((long)src - uVar5);
      UVar1 = 0;
      if (UVar4 - UVar6 < 8) {
        window->lowLimit = UVar4;
        UVar6 = UVar4;
      }
    }
    pBVar3 = (BYTE *)(srcSize + (long)src);
    window->nextSrc = pBVar3;
    if ((pBVar2 + UVar6 < pBVar3) && (src < pBVar2 + (uVar5 & 0xffffffff))) {
      UVar6 = (U32)((long)pBVar3 - (long)pBVar2);
      if ((long)(uVar5 & 0xffffffff) < (long)pBVar3 - (long)pBVar2) {
        UVar6 = (U32)uVar5;
      }
      window->lowLimit = UVar6;
    }
    return UVar1;
  }
  return 1;
}

Assistant:

MEM_STATIC U32 ZSTD_window_update(ZSTD_window_t* window,
                                  void const* src, size_t srcSize,
                                  int forceNonContiguous)
{
    BYTE const* const ip = (BYTE const*)src;
    U32 contiguous = 1;
    DEBUGLOG(5, "ZSTD_window_update");
    if (srcSize == 0)
        return contiguous;
    assert(window->base != NULL);
    assert(window->dictBase != NULL);
    /* Check if blocks follow each other */
    if (src != window->nextSrc || forceNonContiguous) {
        /* not contiguous */
        size_t const distanceFromBase = (size_t)(window->nextSrc - window->base);
        DEBUGLOG(5, "Non contiguous blocks, new segment starts at %u", window->dictLimit);
        window->lowLimit = window->dictLimit;
        assert(distanceFromBase == (size_t)(U32)distanceFromBase);  /* should never overflow */
        window->dictLimit = (U32)distanceFromBase;
        window->dictBase = window->base;
        window->base = ip - distanceFromBase;
        /* ms->nextToUpdate = window->dictLimit; */
        if (window->dictLimit - window->lowLimit < HASH_READ_SIZE) window->lowLimit = window->dictLimit;   /* too small extDict */
        contiguous = 0;
    }
    window->nextSrc = ip + srcSize;
    /* if input and dictionary overlap : reduce dictionary (area presumed modified by input) */
    if ( (ip+srcSize > window->dictBase + window->lowLimit)
       & (ip < window->dictBase + window->dictLimit)) {
        ptrdiff_t const highInputIdx = (ip + srcSize) - window->dictBase;
        U32 const lowLimitMax = (highInputIdx > (ptrdiff_t)window->dictLimit) ? window->dictLimit : (U32)highInputIdx;
        window->lowLimit = lowLimitMax;
        DEBUGLOG(5, "Overlapping extDict and input : new lowLimit = %u", window->lowLimit);
    }
    return contiguous;
}